

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall c4::yml::Tree::is_root(Tree *this,size_t node)

{
  code *pcVar1;
  Location loc;
  Location loc_00;
  Location loc_01;
  bool bVar2;
  undefined1 uVar3;
  error_flags eVar4;
  
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    eVar4 = get_error_flags();
    if ((eVar4 & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        uVar3 = (*pcVar1)();
        return (bool)uVar3;
      }
    }
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc.name.str = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc.name.len = 0x65;
    yml::error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc);
  }
  if ((node != 0) && (this->m_buf[node].m_parent == 0xffffffffffffffff)) {
    eVar4 = get_error_flags();
    if ((eVar4 & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        uVar3 = (*pcVar1)();
        return (bool)uVar3;
      }
    }
    loc_00.super_LineCol.col = 0;
    loc_00.super_LineCol.offset = SUB168(ZEXT816(0x4c04) << 0x40,0);
    loc_00.super_LineCol.line = SUB168(ZEXT816(0x4c04) << 0x40,8);
    loc_00.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_00.name.len = 0x65;
    yml::error("check failed: _p(node)->m_parent != NONE || node == 0",0x35,loc_00);
  }
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    eVar4 = get_error_flags();
    if ((eVar4 & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        uVar3 = (*pcVar1)();
        return (bool)uVar3;
      }
    }
    loc_01.super_LineCol.col = 0;
    loc_01.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_01.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_01.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_01.name.len = 0x65;
    yml::error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_01);
  }
  return this->m_buf[node].m_parent == 0xffffffffffffffff;
}

Assistant:

bool has_parent(size_t node) const { return _p(node)->m_parent != NONE; }